

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_udp.c
# Opt level: O2

int mm_udp_send_pkt(int direction,mm_packet_t *pkt)

{
  FILE *__stream;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  
  (pkt->hdr).start = (pkt->hdr).start | (direction == 3) << 7;
  sVar1 = sendto(sock,pkt,(ulong)(pkt->hdr).pktlen + 1,0,(sockaddr *)&si_dst,0x10);
  __stream = _stderr;
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"%s: sendto() failed: %s\n","mm_udp_send_pkt",pcVar3);
  }
  (pkt->hdr).start = (pkt->hdr).start & 0x7f;
  return 0;
}

Assistant:

int mm_udp_send_pkt(int direction, mm_packet_t *pkt) {
    pkt->hdr.start |= (direction == TX) ? 0x80 : 0;

    /* Send payload over UDP to 127.0.0.1:27273 to facilitate live Wireshark capture. */
    if (sendto(sock, (const char *)&pkt->hdr.start, (size_t)pkt->hdr.pktlen + 1, 0, (struct sockaddr *)&si_dst, sizeof(si_dst)) == SOCKET_ERROR)
    {
#ifdef _WIN32
        fprintf(stderr, "%s: sendto() failed: %d\n", __func__, WSAGetLastError());
#else
        fprintf(stderr, "%s: sendto() failed: %s\n", __func__, strerror(errno));
#endif /* _WIN32 */
    }
    pkt->hdr.start &= 0x7F;
    return 0;
}